

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O2

Vector16 * __thiscall
iDynTree::RigidBodyInertiaNonLinearParametrization::asVectorWithRotationAsVec
          (Vector16 *__return_storage_ptr__,RigidBodyInertiaNonLinearParametrization *this)

{
  double dVar1;
  Matrix<double,_9,_1,_0,_9,_1> vec;
  double *local_c8 [2];
  Rotation *local_b8 [2];
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  Matrix<double,_9,_1,_0,_9,_1> local_60;
  
  dVar1 = (this->com).super_Vector3.m_data[0];
  __return_storage_ptr__->m_data[0] = this->mass;
  __return_storage_ptr__->m_data[1] = dVar1;
  dVar1 = (this->com).super_Vector3.m_data[2];
  __return_storage_ptr__->m_data[2] = (this->com).super_Vector3.m_data[1];
  __return_storage_ptr__->m_data[3] = dVar1;
  local_b8[0] = &this->link_R_centroidal;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_a8,
             (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_b8);
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       local_a8;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1] =
       local_90;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       local_78;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       local_a0;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       local_88;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       local_70;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[6] =
       local_98;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7] =
       local_80;
  local_60.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       local_68;
  local_c8[0] = __return_storage_ptr__->m_data + 4;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,9,1,0,9,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,9,1,0,9,1>>
            ((Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_> *)local_c8,
             &local_60);
  dVar1 = (this->centralSecondMomentOfMass).m_data[1];
  __return_storage_ptr__->m_data[0xd] = (this->centralSecondMomentOfMass).m_data[0];
  __return_storage_ptr__->m_data[0xe] = dVar1;
  __return_storage_ptr__->m_data[0xf] = (this->centralSecondMomentOfMass).m_data[2];
  return __return_storage_ptr__;
}

Assistant:

Vector16 RigidBodyInertiaNonLinearParametrization::asVectorWithRotationAsVec() const
{
    using namespace Eigen;

    Vector16 vectorization;

    vectorization(0) = this->mass;

    vectorization(1) = this->com(0);
    vectorization(2) = this->com(1);
    vectorization(3) = this->com(2);

    Map< Matrix<double, 9, 1> >(vectorization.data()+4) = vecColMajor(toEigen(this->link_R_centroidal));

    vectorization(13) = this->centralSecondMomentOfMass(0);
    vectorization(14) = this->centralSecondMomentOfMass(1);
    vectorization(15) = this->centralSecondMomentOfMass(2);



    return vectorization;
}